

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::WatWriter::WriteTag(WatWriter *this,Tag *tag)

{
  string_view str;
  Tag *tag_local;
  WatWriter *this_local;
  
  WriteOpenSpace(this,"tag");
  str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)tag);
  WriteNameOrIndex(this,str,this->tag_index_,Space);
  WriteInlineExports(this,Last,this->tag_index_);
  WriteInlineImport(this,Last,this->tag_index_);
  if (((tag->decl).has_func_type & 1U) != 0) {
    WriteOpenSpace(this,"type");
    WriteVar(this,&(tag->decl).type_var,None);
    WriteCloseSpace(this);
  }
  WriteTypes(this,&(tag->decl).sig.param_types,"param");
  this->tag_index_ = this->tag_index_ + 1;
  WriteCloseNewline(this);
  return;
}

Assistant:

void WatWriter::WriteTag(const Tag& tag) {
  WriteOpenSpace("tag");
  WriteNameOrIndex(tag.name, tag_index_, NextChar::Space);
  WriteInlineExports(ExternalKind::Tag, tag_index_);
  WriteInlineImport(ExternalKind::Tag, tag_index_);
  if (tag.decl.has_func_type) {
    WriteOpenSpace("type");
    WriteVar(tag.decl.type_var, NextChar::None);
    WriteCloseSpace();
  }
  WriteTypes(tag.decl.sig.param_types, "param");
  ++tag_index_;
  WriteCloseNewline();
}